

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O3

RC __thiscall QL_NodeSel::PrintNode(QL_NodeSel *this,int numTabs)

{
  char **ppcVar1;
  Condition *pCVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Condition condition;
  Condition *pCVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = numTabs;
  if (0 < numTabs) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--SEL: ",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  if (0 < (this->super_QL_Node).condIndex) {
    lVar7 = 0;
    do {
      iVar6 = numTabs;
      if (0 < numTabs) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      pCVar2 = ((this->super_QL_Node).qlm)->condptr;
      iVar6 = (this->super_QL_Node).condsInNode[lVar7];
      pCVar5 = pCVar2 + iVar6;
      uVar3 = pCVar5->op;
      uVar4 = pCVar5->bRhsIsAttr;
      condition.bRhsIsAttr = uVar4;
      condition.op = uVar3;
      ppcVar1 = &pCVar2[iVar6].rhsAttr.attrName;
      condition.lhsAttr = pCVar2[iVar6].lhsAttr;
      condition.rhsAttr.relName = ((RelAttr *)(&pCVar5->op + 2))->relName;
      condition.rhsAttr.attrName = *ppcVar1;
      condition.rhsValue._0_8_ = ppcVar1[1];
      condition.rhsValue.data = pCVar2[iVar6].rhsValue.data;
      QL_Node::PrintCondition(&this->super_QL_Node,condition);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->super_QL_Node).condIndex);
  }
  (*this->prevNode->_vptr_QL_Node[5])(this->prevNode,(ulong)(numTabs + 1));
  return 0;
}

Assistant:

RC QL_NodeSel::PrintNode(int numTabs){
  for(int i=0; i < numTabs; i++){
    cout << "\t";
  }
  cout << "--SEL: " << endl;
  for(int i = 0; i < condIndex; i++){
    for(int j=0; j <numTabs; j++){
      cout << "\t";
    }
    PrintCondition(qlm.condptr[condsInNode[i]]);
    cout << "\n";
  }
  prevNode.PrintNode(numTabs + 1);

  return (0);
}